

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

GroupInfo Js::RegexHelper::PrimMatch
                    (RegexMatchState *state,ScriptContext *scriptContext,RegexPattern *pattern,
                    CharCount inputLength,CharCount offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegexStatsDatabase *pRVar4;
  RegexStats *stats;
  DebugWriter *w;
  GroupInfo GVar5;
  
  if ((pattern->rep).unified.program.ptr == (Program *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x784,"(pattern->rep.unified.program != 0)",
                                "pattern->rep.unified.program != 0");
    if (!bVar2) goto LAB_00d4e23d;
    *puVar3 = 0;
  }
  if ((pattern->rep).unified.matcher.ptr == (Matcher *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                ,0x785,"(pattern->rep.unified.matcher != 0)",
                                "pattern->rep.unified.matcher != 0");
    if (!bVar2) {
LAB_00d4e23d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (DAT_015d3479 == '\x01') {
    pRVar4 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    stats = UnifiedRegex::RegexStatsDatabase::GetRegexStats(pRVar4,pattern);
    pRVar4 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    UnifiedRegex::RegexStatsDatabase::BeginProfile(pRVar4);
  }
  else {
    stats = (RegexStats *)0x0;
  }
  if ((DAT_015d3478 == '\x01') && (DAT_015d346a == '\x01')) {
    w = ScriptContext::GetRegexDebugWriter(scriptContext);
  }
  else {
    w = (DebugWriter *)0x0;
  }
  UnifiedRegex::Matcher::Match
            ((pattern->rep).unified.matcher.ptr,state->input,inputLength,offset,scriptContext,stats,
             w);
  if (DAT_015d3479 == '\x01') {
    pRVar4 = ScriptContext::GetRegexStatsDatabase(scriptContext);
    UnifiedRegex::RegexStatsDatabase::EndProfile(pRVar4,stats,Execute);
  }
  GVar5 = UnifiedRegex::RegexPattern::GetGroup(pattern,0);
  return GVar5;
}

Assistant:

UnifiedRegex::GroupInfo
    RegexHelper::PrimMatch(RegexMatchState& state, ScriptContext* scriptContext, UnifiedRegex::RegexPattern* pattern, CharCount inputLength, CharCount offset)
    {
        Assert(pattern->rep.unified.program != 0);
        Assert(pattern->rep.unified.matcher != 0);
#if ENABLE_REGEX_CONFIG_OPTIONS
        UnifiedRegex::RegexStats* stats = 0;
        if (REGEX_CONFIG_FLAG(RegexProfile))
        {
            stats = scriptContext->GetRegexStatsDatabase()->GetRegexStats(pattern);
            scriptContext->GetRegexStatsDatabase()->BeginProfile();
        }
        UnifiedRegex::DebugWriter* w = 0;
        if (REGEX_CONFIG_FLAG(RegexTracing) && CONFIG_FLAG(Verbose))
            w = scriptContext->GetRegexDebugWriter();
#endif

        pattern->rep.unified.matcher->Match
            (state.input
                , inputLength
                , offset
                , scriptContext
#if ENABLE_REGEX_CONFIG_OPTIONS
                , stats
                , w
#endif
                );

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (REGEX_CONFIG_FLAG(RegexProfile))
            scriptContext->GetRegexStatsDatabase()->EndProfile(stats, UnifiedRegex::RegexStats::Execute);
#endif
        return pattern->GetGroup(0);
    }